

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  DescriptorPool *pDVar1;
  GeneratedMessageFactory *pGVar2;
  DescriptorPool *pDVar3;
  LogMessage *pLVar4;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false,_true>,_bool>
  pVar5;
  __node_gen_type __node_gen;
  hash_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *local_a8;
  Descriptor *local_a0;
  Message *local_98;
  LogMessage local_68;
  
  pGVar2 = anon_unknown_1::GeneratedMessageFactory::singleton();
  pDVar1 = *(DescriptorPool **)(*(long *)(descriptor + 0x10) + 0x10);
  pDVar3 = DescriptorPool::generated_pool();
  if (pDVar1 != pDVar3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x131);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (descriptor->file()->pool()) == (DescriptorPool::generated_pool()): "
                       );
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,
                        "Tried to register a non-generated type with the generated type registry.");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  internal::Mutex::AssertHeld(&pGVar2->mutex_);
  local_a8 = &pGVar2->type_map_;
  local_a0 = descriptor;
  local_98 = prototype;
  pVar5 = std::
          _Hashtable<google::protobuf::Descriptor_const*,std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>,std::__detail::_Select1st,std::equal_to<google::protobuf::Descriptor_const*>,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_insert<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>,true>>>>
                    ((_Hashtable<google::protobuf::Descriptor_const*,std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>,std::__detail::_Select1st,std::equal_to<google::protobuf::Descriptor_const*>,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_a8);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x13a);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_a0,"Type is already registered: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,*(string **)(descriptor + 8));
    internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&local_a0);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}